

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,Payload *v)

{
  if (((v->asset_path).asset_path_._M_string_length == 0) && (((v->prim_path)._valid & 1U) == 0)) {
    std::operator<<(ofs,"None");
  }
  else {
    operator<<(ofs,&v->asset_path);
    if ((v->prim_path)._valid == true) {
      operator<<(ofs,&v->prim_path);
    }
    operator<<(ofs,&v->layerOffset);
  }
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Payload &v) {
  if (v.is_none()) {
    ofs << "None";
  } else {
    ofs << v.asset_path;
    if (v.prim_path.is_valid()) {
      ofs << v.prim_path;
    }
    ofs << v.layerOffset;
  }

  return ofs;
}